

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O3

void __thiscall
Js::JavascriptWeakMap::ExtractSnapObjectDataInto
          (JavascriptWeakMap *this,SnapObject *objData,SlabAllocator *alloc)

{
  int iVar1;
  RecyclableObject *key;
  code *pcVar2;
  undefined4 *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  JavascriptWeakMap *pJVar7;
  Type *pTVar8;
  Var pvVar9;
  ulong actualCount;
  undefined **this_00;
  int last;
  int i;
  void *local_90;
  void *local_88;
  JavascriptWeakMap *local_80;
  Var local_78;
  undefined4 *local_70;
  SnapObject *local_68;
  Var local_60;
  Var value;
  SlabAllocator *local_50;
  ulong local_48;
  JavascriptWeakMap *local_40;
  ulong local_38;
  
  local_68 = objData;
  pJVar7 = (JavascriptWeakMap *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  local_80 = (JavascriptWeakMap *)&this->keySet;
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  uVar5 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  local_38 = (ulong)uVar5;
  *(undefined4 *)
   &(pJVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
  local_48 = (ulong)(uVar5 * 2 + 1);
  local_50 = alloc;
  pTVar8 = (Type *)TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,local_48);
  (pJVar7->super_DynamicObject).super_RecyclableObject.type.ptr = pTVar8;
  uVar5 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .bucketCount;
  local_40 = pJVar7;
  if (uVar5 != 0) {
    local_38 = (ulong)(uint)((int)local_38 * 2);
    local_88 = (void *)((ulong)this | 1);
    this_00 = &PTR_01548f08;
    local_70 = (undefined4 *)__tls_get_addr();
    pvVar9 = (Var)0x0;
    do {
      i = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[(long)pvVar9];
      if (i != -1) {
        last = -1;
        value = pvVar9;
        do {
          key = (this->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .weakRefs.ptr[i].ptr;
          if (key == (RecyclableObject *)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            this_00 = (undefined **)local_80;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)local_80,i,last,(uint)value);
          }
          else {
            local_60 = (Var)0x0;
            pJVar7 = (JavascriptWeakMap *)GetWeakMapKeyMapFromKey((JavascriptWeakMap *)this_00,key);
            if (pJVar7 != (JavascriptWeakMap *)0x0) {
              local_90 = local_88;
              this_00 = (undefined **)pJVar7;
              bVar4 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                     *)pJVar7,&local_90);
              if (bVar4) {
                KeyMapGet(this,(WeakMapKeyMap *)pJVar7,&local_60);
                uVar6 = *(uint *)&(local_40->super_DynamicObject).super_RecyclableObject.
                                  super_FinalizableObject.super_IRecyclerVisitedObject.
                                  _vptr_IRecyclerVisitedObject;
                uVar5 = uVar6 + 1;
                pvVar9 = local_60;
                if ((uint)local_38 <= uVar5) {
                  local_78 = local_60;
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar3 = local_70;
                  *local_70 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                              ,0x1a0,"(smi->MapSize + 1 < mapCountEst)",
                                              "We are writing junk");
                  if (!bVar4) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  *puVar3 = 0;
                  uVar6 = *(uint *)&(local_40->super_DynamicObject).super_RecyclableObject.
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject;
                  uVar5 = uVar6 + 1;
                  pvVar9 = local_78;
                }
                *(RecyclableObject **)
                 (&((local_40->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId +
                 (ulong)uVar6 * 2) = key;
                *(Var *)(&((local_40->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId
                        + (ulong)uVar5 * 2) = pvVar9;
                *(uint *)&(local_40->super_DynamicObject).super_RecyclableObject.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject = uVar6 + 2;
                this_00 = (undefined **)local_40;
              }
            }
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            last = i;
          }
          i = iVar1;
        } while (i != -1);
        uVar5 = (this->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .bucketCount;
        pvVar9 = value;
      }
      pvVar9 = (Var)((long)pvVar9 + 1);
    } while (pvVar9 < (Var)(ulong)uVar5);
  }
  pJVar7 = local_40;
  actualCount = (ulong)*(uint *)&(local_40->super_DynamicObject).super_RecyclableObject.
                                 super_FinalizableObject.super_IRecyclerVisitedObject.
                                 _vptr_IRecyclerVisitedObject;
  if (actualCount == 0) {
    (local_40->super_DynamicObject).super_RecyclableObject.type.ptr = (Type *)0x0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>(local_50,local_48);
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>(local_50,actualCount,local_48);
  }
  if (local_68->SnapObjectTag == SnapMapObject) {
    local_68->AddtlSnapObjectInfo = pJVar7;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void JavascriptWeakMap::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapMapInfo* smi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>();
        uint32 mapCountEst = this->Size() * 2;

        smi->MapSize = 0;
        smi->MapKeyValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(mapCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            AssertMsg(smi->MapSize + 1 < mapCountEst, "We are writing junk");

            smi->MapKeyValueArray[smi->MapSize] = key;
            smi->MapKeyValueArray[smi->MapSize + 1] = value;
            smi->MapSize += 2;
        });

        if(smi->MapSize == 0)
        {
            smi->MapKeyValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(mapCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(smi->MapSize, mapCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapMapInfo*, TTD::NSSnapObjects::SnapObjectType::SnapMapObject>(objData, smi);
    }